

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O0

void __thiscall gtar::Record::operator=(Record *this,Record *rhs)

{
  Record *rhs_local;
  Record *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)rhs);
  std::__cxx11::string::operator=((string *)&this->m_name,(string *)&rhs->m_name);
  std::__cxx11::string::operator=((string *)&this->m_index,(string *)&rhs->m_index);
  this->m_behavior = rhs->m_behavior;
  this->m_format = rhs->m_format;
  this->m_resolution = rhs->m_resolution;
  return;
}

Assistant:

void Record::operator=(const Record &rhs)
    {
        m_group = rhs.m_group;
        m_name = rhs.m_name;
        m_index = rhs.m_index;
        m_behavior = rhs.m_behavior;
        m_format = rhs.m_format;
        m_resolution = rhs.m_resolution;
    }